

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTexture2LookupTestCase::verifyLookupTextureData
          (SparseTexture2LookupTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level,FunctionToken *funcToken)

{
  pointer *this_00;
  glUseProgramFunc p_Var1;
  undefined *__s;
  bool bVar2;
  int iVar3;
  int iVar4;
  GLenum GVar5;
  deUint32 dVar6;
  ostream *poVar7;
  TestError *this_01;
  uchar *ptr;
  GLchar *pGVar8;
  RenderContext *renderCtx;
  ShaderInfo *pSVar9;
  ProgramInfo *pPVar10;
  char *pcVar11;
  GLubyte *outDataRegion;
  GLubyte *dataRegion;
  int local_698;
  GLint x;
  GLint y;
  GLint z;
  ShaderProgram program;
  undefined1 local_598 [8];
  ProgramSources sources;
  string local_4a8;
  string local_488;
  undefined1 local_468 [8];
  TokenStringsExt s;
  undefined1 local_140 [8];
  string shader;
  GLuint local_118;
  int sample;
  GLuint verifyTexture;
  GLint verifyTarget;
  FunctionToken f;
  GLubyte *out_data;
  GLubyte *exp_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  byte local_55;
  GLint texSize;
  GLuint GStack_50;
  bool result;
  GLint widthCommitted;
  GLint depth;
  GLint height;
  GLint width;
  GLint local_34;
  GLuint *pGStack_30;
  GLint level_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTexture2LookupTestCase *this_local;
  
  local_34 = level;
  pGStack_30 = texture;
  texture_local._0_4_ = format;
  texture_local._4_4_ = target;
  _format_local = gl;
  gl_local = (Functions *)this;
  poVar7 = std::operator<<((ostream *)
                           &(this->super_SparseTexture2CommitmentTestCase).
                            super_SparseTextureCommitmentTestCase.field_0x88,
                           "Verify Lookup Texture Data [function: ");
  poVar7 = std::operator<<(poVar7,(string *)funcToken);
  poVar7 = std::operator<<(poVar7,", level: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_34);
  std::operator<<(poVar7,"] - ");
  if (local_34 <=
      (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      levels + -1) {
    SparseTextureUtils::getTextureLevelSize
              (texture_local._4_4_,
               &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase
                .mState,local_34,&depth,&widthCommitted,(GLint *)&stack0xffffffffffffffb0);
    iVar3 = depth / 2;
    if (((iVar3 == 0) || (widthCommitted == 0)) ||
       ((int)GStack_50 <
        (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
        minDepth)) {
      this_local._7_1_ = 1;
    }
    else {
      local_55 = 1;
      if (texture_local._4_4_ == 0x8513) {
        GStack_50 = GStack_50 * 6;
      }
      iVar4 = depth * widthCommitted * GStack_50;
      this_00 = &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(long)iVar4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data,(long)iVar4);
      ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      ::deMemset(ptr,0xff,(long)iVar4);
      FunctionToken::FunctionToken((FunctionToken *)&verifyTexture,funcToken);
      if (texture_local._4_4_ == 0x9100) {
        sample = 0xde1;
      }
      else {
        sample = 0x8c1a;
      }
      gl4cts::Texture::Generate(_format_local,&local_118);
      gl4cts::Texture::Bind(_format_local,local_118,sample);
      gl4cts::Texture::Storage(_format_local,sample,1,0x8229,depth,widthCommitted,GStack_50);
      GVar5 = (*_format_local->getError)();
      glu::checkError(GVar5,"Texture::Storage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                      ,0xadc);
      for (shader.field_2._12_4_ = 0;
          (int)shader.field_2._12_4_ <
          (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
          mState.samples; shader.field_2._12_4_ = shader.field_2._12_4_ + 1) {
        ::deMemset((void *)f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,0,
                   (long)iVar4);
        gl4cts::Texture::Bind(_format_local,local_118,sample);
        gl4cts::Texture::SubImage
                  (_format_local,sample,0,0,0,0,depth,widthCommitted,GStack_50,0x1903,0x1401,
                   (GLvoid *)f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        GVar5 = (*_format_local->getError)();
        glu::checkError(GVar5,"Texture::SubImage",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0xae5);
        __s = st2_compute_lookupVerify;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_140,__s,
                   (allocator<char> *)(s.pointCoord.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator
                  ((allocator<char> *)(s.pointCoord.field_2._M_local_buf + 0xf));
        createLookupShaderTokens
                  ((TokenStringsExt *)local_468,this,texture_local._4_4_,(GLenum)texture_local,
                   local_34,shader.field_2._12_4_,(FunctionToken *)&verifyTexture);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<FUNCTION>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<ARGUMENTS>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<OUTPUT_TYPE>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<INPUT_TYPE>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<SIZE_DEF>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<LOD>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<LOD_DEF>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<COORD_TYPE>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<ICOORD_TYPE>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<COORD_DEF>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<POINT_TYPE>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<POINT_DEF>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<RETURN_TYPE>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<RESULT_EXPECTED>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<EPSILON>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<SAMPLE_DEF>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<REFZ_DEF>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<POINT_COORD>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<COMPONENT_DEF>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<CUBE_MAP_COORD_DEF>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<OFFSET_ARRAY_DEF>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<FORMAT_DEF>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<OFFSET_TYPE>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<NOFFSET_TYPE>",pGVar8,(string *)local_140);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<OFFSET_DIM>",pGVar8,(string *)local_140);
        de::toString<int>(&local_488,&depth);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<TEX_WIDTH>",pGVar8,(string *)local_140);
        std::__cxx11::string::~string((string *)&local_488);
        de::toString<int>(&local_4a8,&widthCommitted);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<TEX_HEIGHT>",pGVar8,(string *)local_140);
        std::__cxx11::string::~string((string *)&local_4a8);
        de::toString<int>((string *)&sources.separable,(int *)&stack0xffffffffffffffb0);
        pGVar8 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<TEX_DEPTH>",pGVar8,(string *)local_140);
        std::__cxx11::string::~string((string *)&sources.separable);
        glu::ProgramSources::ProgramSources((ProgramSources *)local_598);
        glu::ComputeSource::ComputeSource
                  ((ComputeSource *)&program.m_program.m_info.linkTimeUs,(string *)local_140);
        glu::ProgramSources::operator<<
                  ((ProgramSources *)local_598,(ShaderSource *)&program.m_program.m_info.linkTimeUs)
        ;
        glu::ComputeSource::~ComputeSource((ComputeSource *)&program.m_program.m_info.linkTimeUs);
        renderCtx = deqp::Context::getRenderContext
                              ((this->super_SparseTexture2CommitmentTestCase).
                               super_SparseTextureCommitmentTestCase.super_TestCase.m_context);
        glu::ShaderProgram::ShaderProgram((ShaderProgram *)&y,renderCtx,(ProgramSources *)local_598)
        ;
        bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)&y);
        if (bVar2) {
          p_Var1 = _format_local->useProgram;
          dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)&y);
          (*p_Var1)(dVar6);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"glUseProgram",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb13);
          (*_format_local->bindImageTexture)(1,local_118,0,'\x01',0,0x88b9,0x8232);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb1c);
          (*_format_local->uniform1i)(1,1);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb1e);
          bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&verifyTexture,"sparseImageLoadARB");
          if (bVar2) {
            (*_format_local->activeTexture)(0x84c0);
            GVar5 = (*_format_local->getError)();
            glu::checkError(GVar5,"glActiveTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xb24);
            (*_format_local->bindTexture)(texture_local._4_4_,*pGStack_30);
            GVar5 = (*_format_local->getError)();
            glu::checkError(GVar5,"glBindTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xb26);
            (*_format_local->uniform1i)(2,0);
            GVar5 = (*_format_local->getError)();
            glu::checkError(GVar5,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xb28);
          }
          else {
            (*_format_local->bindImageTexture)
                      (0,*pGStack_30,local_34,'\0',0,35000,(GLenum)texture_local);
            GVar5 = (*_format_local->getError)();
            glu::checkError(GVar5,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xb32);
            (*_format_local->uniform1i)(2,0);
            GVar5 = (*_format_local->getError)();
            glu::checkError(GVar5,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xb34);
          }
          (*_format_local->uniform1i)(3,iVar3);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb39);
          (*_format_local->dispatchCompute)(depth,widthCommitted,GStack_50);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"glDispatchCompute",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb3b);
          (*_format_local->memoryBarrier)(0xffffffff);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"glMemoryBarrier",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb3d);
          gl4cts::Texture::Bind(_format_local,local_118,sample);
          gl4cts::Texture::GetData
                    (_format_local,0,sample,0x1903,0x1401,
                     (GLvoid *)f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"Texture::GetData",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb41);
          for (x = 0; x < (int)GStack_50; x = x + 1) {
            for (local_698 = 0; local_698 < widthCommitted; local_698 = local_698 + 1) {
              for (dataRegion._4_4_ = 0; dataRegion._4_4_ < depth;
                  dataRegion._4_4_ = dataRegion._4_4_ + 1) {
                if (ptr[(long)(x * depth * widthCommitted) +
                        (long)(local_698 * depth) + (long)dataRegion._4_4_] !=
                    *(uchar *)(f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count +
                               (long)dataRegion._4_4_ + (long)(local_698 * depth) +
                              (long)(x * depth * widthCommitted))) {
                  local_55 = 0;
                }
              }
            }
          }
        }
        else {
          poVar7 = std::operator<<((ostream *)
                                   &(this->super_SparseTexture2CommitmentTestCase).
                                    super_SparseTextureCommitmentTestCase.field_0x88,
                                   "Compute shader compilation failed (lookup) for target: ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,texture_local._4_4_);
          poVar7 = std::operator<<(poVar7,", format: ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,(GLenum)texture_local);
          poVar7 = std::operator<<(poVar7,", shaderInfoLog: ");
          pSVar9 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)&y,SHADERTYPE_COMPUTE,0);
          poVar7 = std::operator<<(poVar7,(string *)&pSVar9->infoLog);
          poVar7 = std::operator<<(poVar7,", programInfoLog: ");
          pPVar10 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)&y);
          poVar7 = std::operator<<(poVar7,(string *)pPVar10);
          poVar7 = std::operator<<(poVar7,", shaderSource: ");
          pcVar11 = (char *)std::__cxx11::string::c_str();
          poVar7 = std::operator<<(poVar7,pcVar11);
          std::operator<<(poVar7," - ");
          local_55 = 0;
        }
        glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&y);
        glu::ProgramSources::~ProgramSources((ProgramSources *)local_598);
        TokenStringsExt::~TokenStringsExt((TokenStringsExt *)local_468);
        std::__cxx11::string::~string((string *)local_140);
      }
      gl4cts::Texture::Delete(_format_local,&local_118);
      this_local._7_1_ = local_55;
      FunctionToken::~FunctionToken((FunctionToken *)&verifyTexture);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    return (bool)(this_local._7_1_ & 1);
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid level",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
             ,0xab0);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool SparseTexture2LookupTestCase::verifyLookupTextureData(const Functions& gl, GLint target, GLint format,
														   GLuint& texture, GLint level, FunctionToken& funcToken)
{
	mLog << "Verify Lookup Texture Data [function: " << funcToken.name << ", level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = depth * 6;

	GLint texSize = width * height * depth;

	std::vector<GLubyte> vecExpData;
	std::vector<GLubyte> vecOutData;
	vecExpData.resize(texSize);
	vecOutData.resize(texSize);
	GLubyte* exp_data = vecExpData.data();
	GLubyte* out_data = vecOutData.data();

	// Expected data is 255 because
	deMemset(exp_data, 255, texSize);

	// Make token copy to work on
	FunctionToken f = funcToken;

	// Create verifying texture
	GLint verifyTarget;
	if (target == GL_TEXTURE_2D_MULTISAMPLE)
		verifyTarget = GL_TEXTURE_2D;
	else
		verifyTarget = GL_TEXTURE_2D_ARRAY;

	GLuint verifyTexture;
	Texture::Generate(gl, verifyTexture);
	Texture::Bind(gl, verifyTexture, verifyTarget);
	Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

	for (int sample = 0; sample < mState.samples; ++sample)
	{
		deMemset(out_data, 0, texSize);

		Texture::Bind(gl, verifyTexture, verifyTarget);
		Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, depth, GL_RED, GL_UNSIGNED_BYTE,
						  (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

		std::string shader = st2_compute_lookupVerify;

		// Adjust shader source to texture format
		TokenStringsExt s = createLookupShaderTokens(target, format, level, sample, f);

		replaceToken("<FUNCTION>", f.name.c_str(), shader);
		replaceToken("<ARGUMENTS>", f.arguments.c_str(), shader);

		replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), shader);
		replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
		replaceToken("<SIZE_DEF>", s.sizeDef.c_str(), shader);
		replaceToken("<LOD>", s.lod.c_str(), shader);
		replaceToken("<LOD_DEF>", s.lodDef.c_str(), shader);
		replaceToken("<COORD_TYPE>", s.coordType.c_str(), shader);
		replaceToken("<ICOORD_TYPE>", s.iCoordType.c_str(), shader);
		replaceToken("<COORD_DEF>", s.coordDef.c_str(), shader);
		replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
		replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
		replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
		replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), shader);
		replaceToken("<EPSILON>", s.epsilon.c_str(), shader);
		replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);
		replaceToken("<REFZ_DEF>", s.refZDef.c_str(), shader);
		replaceToken("<POINT_COORD>", s.pointCoord.c_str(), shader);
		replaceToken("<COMPONENT_DEF>", s.componentDef.c_str(), shader);
		replaceToken("<CUBE_MAP_COORD_DEF>", s.cubeMapCoordDef.c_str(), shader);
		replaceToken("<OFFSET_ARRAY_DEF>", s.offsetArrayDef.c_str(), shader);
		replaceToken("<FORMAT_DEF>", s.formatDef.c_str(), shader);
		replaceToken("<OFFSET_TYPE>", s.offsetType.c_str(), shader);
		replaceToken("<NOFFSET_TYPE>", s.nOffsetType.c_str(), shader);
		replaceToken("<OFFSET_DIM>", s.offsetDim.c_str(), shader);

		replaceToken("<TEX_WIDTH>", de::toString(width).c_str(), shader);
		replaceToken("<TEX_HEIGHT>", de::toString(height).c_str(), shader);
		replaceToken("<TEX_DEPTH>", de::toString(depth).c_str(), shader);

		ProgramSources sources;
		sources << ComputeSource(shader);

		// Build and run shader
		ShaderProgram program(m_context.getRenderContext(), sources);
		if (program.isOk())
		{
			gl.useProgram(program.getProgram());
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");

			// Pass output image to shader
			gl.bindImageTexture(1, //unit
								verifyTexture,
								0,		 //level
								GL_TRUE, //layered
								0,		 //layer
								GL_WRITE_ONLY, GL_R8UI);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
			gl.uniform1i(1, 1 /* image_unit */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

			// Pass input sampler/image to shader
			if (f.name != "sparseImageLoadARB")
			{
				gl.activeTexture(GL_TEXTURE0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture");
				gl.bindTexture(target, texture);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture");
				gl.uniform1i(2, 0 /* sampler_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			}
			else
			{
				gl.bindImageTexture(0, //unit
									texture,
									level,	//level
									GL_FALSE, //layered
									0,		  //layer
									GL_READ_ONLY, format);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.uniform1i(2, 0 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			}

			// Pass committed region width to shader
			gl.uniform1i(3, widthCommitted /* committed region width */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.dispatchCompute(width, height, depth);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
			gl.memoryBarrier(GL_ALL_BARRIER_BITS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint z = 0; z < depth; ++z)
				for (GLint y = 0; y < height; ++y)
					for (GLint x = 0; x < width; ++x)
					{
						GLubyte* dataRegion	= exp_data + x + y * width + z * width * height;
						GLubyte* outDataRegion = out_data + x + y * width + z * width * height;
						if (dataRegion[0] != outDataRegion[0])
							result = false;
					}
		}
		else
		{
			mLog << "Compute shader compilation failed (lookup) for target: " << target << ", format: " << format
				 << ", shaderInfoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
				 << ", programInfoLog: " << program.getProgramInfo().infoLog << ", shaderSource: " << shader.c_str()
				 << " - ";

			result = false;
		}
	}

	Texture::Delete(gl, verifyTexture);

	return result;
}